

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_tls_accept(intptr_t uuid,void *tls,void *udata)

{
  void *udata_local;
  void *tls_local;
  intptr_t uuid_local;
  
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR("FATAL: No supported SSL/TLS library available.");
  }
  exit(-1);
}

Assistant:

void FIO_TLS_WEAK fio_tls_accept(intptr_t uuid, void *tls, void *udata) {
  FIO_LOG_FATAL("No supported SSL/TLS library available.");
  exit(-1);
  return;
  (void)uuid;
  (void)tls;
  (void)udata;
}